

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_hash_set.c
# Opt level: O1

TIFFHashSet *
TIFFHashSetNew(TIFFHashSetHashFunc fnHashFunc,TIFFHashSetEqualFunc fnEqualFunc,
              TIFFHashSetFreeEltFunc fnFreeEltFunc)

{
  TIFFHashSet *__ptr;
  code *pcVar1;
  TIFFList **ppTVar2;
  code *pcVar3;
  
  __ptr = (TIFFHashSet *)malloc(0x40);
  if (__ptr != (TIFFHashSet *)0x0) {
    pcVar1 = TIFFHashSetHashPointer;
    if (fnHashFunc != (TIFFHashSetHashFunc)0x0) {
      pcVar1 = fnHashFunc;
    }
    pcVar3 = TIFFHashSetEqualPointer;
    if (fnEqualFunc != (TIFFHashSetEqualFunc)0x0) {
      pcVar3 = fnEqualFunc;
    }
    __ptr->fnHashFunc = pcVar1;
    __ptr->fnEqualFunc = pcVar3;
    __ptr->fnFreeEltFunc = fnFreeEltFunc;
    __ptr->nSize = 0;
    ppTVar2 = (TIFFList **)calloc(8,0x35);
    __ptr->tabList = ppTVar2;
    if (ppTVar2 != (TIFFList **)0x0) {
      __ptr->nIndiceAllocatedSize = 0;
      __ptr->nAllocatedSize = 0x35;
      __ptr->psRecyclingList = (TIFFList *)0x0;
      __ptr->nRecyclingListSize = 0;
      __ptr->bRehash = false;
      return __ptr;
    }
    free(__ptr);
  }
  return (TIFFHashSet *)0x0;
}

Assistant:

TIFFHashSet *TIFFHashSetNew(TIFFHashSetHashFunc fnHashFunc,
                            TIFFHashSetEqualFunc fnEqualFunc,
                            TIFFHashSetFreeEltFunc fnFreeEltFunc)
{
    TIFFHashSet *set = (TIFFHashSet *)malloc(sizeof(TIFFHashSet));
    if (set == NULL)
        return NULL;
    set->fnHashFunc = fnHashFunc ? fnHashFunc : TIFFHashSetHashPointer;
    set->fnEqualFunc = fnEqualFunc ? fnEqualFunc : TIFFHashSetEqualPointer;
    set->fnFreeEltFunc = fnFreeEltFunc;
    set->nSize = 0;
    set->tabList = (TIFFList **)(calloc(sizeof(TIFFList *), 53));
    if (set->tabList == NULL)
    {
        free(set);
        return NULL;
    }
    set->nIndiceAllocatedSize = 0;
    set->nAllocatedSize = 53;
    set->psRecyclingList = NULL;
    set->nRecyclingListSize = 0;
    set->bRehash = false;
#ifdef HASH_DEBUG
    set->nCollisions = 0;
#endif
    return set;
}